

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O1

GLuint __thiscall
deqp::egl::anon_unknown_0::TestContext::createTextureFromImage(TestContext *this,EGLImageKHR image)

{
  uint in_EAX;
  GLenum err;
  GLuint texture;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  (*(this->m_gl).genTextures)(1,(GLuint *)((long)&uStack_18 + 4));
  (*(this->m_gl).bindTexture)(0xde1,uStack_18._4_4_);
  (*(this->m_gl).eglImageTargetTexture2DOES)(0xde1,image);
  (*(this->m_gl).bindTexture)(0xde1,0);
  err = (*(this->m_gl).getError)();
  glu::checkError(err,"Creating texture from image",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x275);
  return uStack_18._4_4_;
}

Assistant:

GLuint TestContext::createTextureFromImage (EGLImageKHR image)
{
	GLuint texture = 0;

	try
	{
		m_gl.genTextures(1, &texture);
		m_gl.bindTexture(GL_TEXTURE_2D, texture);
		m_gl.eglImageTargetTexture2DOES(GL_TEXTURE_2D, image);
		m_gl.bindTexture(GL_TEXTURE_2D, 0);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "Creating texture from image");

		return texture;
	}
	catch (...)
	{
		m_gl.deleteTextures(1, &texture);
		throw;
	}
}